

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

bool __thiscall ASDCP::MXF::FactoryCompareUL::operator()(FactoryCompareUL *this,UL *lhs,UL *rhs)

{
  byte_t bVar1;
  byte bVar2;
  ui32_t uVar3;
  ui32_t uVar4;
  byte_t *pbVar5;
  uint local_38;
  uint local_30;
  ui32_t i;
  ui32_t test_size;
  UL *rhs_local;
  UL *lhs_local;
  FactoryCompareUL *this_local;
  
  uVar3 = Kumu::Identifier<16U>::Size(&lhs->super_Identifier<16U>);
  uVar4 = Kumu::Identifier<16U>::Size(&rhs->super_Identifier<16U>);
  if (uVar3 < uVar4) {
    local_38 = Kumu::Identifier<16U>::Size(&lhs->super_Identifier<16U>);
  }
  else {
    local_38 = Kumu::Identifier<16U>::Size(&rhs->super_Identifier<16U>);
  }
  local_30 = 0;
  do {
    if (local_38 <= local_30) {
      return false;
    }
    if (local_30 != 7) {
      pbVar5 = Kumu::Identifier<16U>::Value(&lhs->super_Identifier<16U>);
      bVar1 = pbVar5[local_30];
      pbVar5 = Kumu::Identifier<16U>::Value(&rhs->super_Identifier<16U>);
      if (bVar1 != pbVar5[local_30]) {
        pbVar5 = Kumu::Identifier<16U>::Value(&lhs->super_Identifier<16U>);
        bVar2 = pbVar5[local_30];
        pbVar5 = Kumu::Identifier<16U>::Value(&rhs->super_Identifier<16U>);
        return bVar2 < pbVar5[local_30];
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool operator()(const ASDCP::UL& lhs, const ASDCP::UL& rhs) const
        {
            ui32_t test_size = lhs.Size() < rhs.Size() ? lhs.Size() : rhs.Size();

            for (ui32_t i = 0; i < test_size; i++)
            {
                if (i == 7) continue; // skip version to be symmetrical with UL::operator==
                if (lhs.Value()[i] != rhs.Value()[i])
                    return lhs.Value()[i] < rhs.Value()[i];
            }

            return false;
        }